

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_access.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Row_access<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
::update_entry(Row_access<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
               *this,Matrix_entry *entry)

{
  Matrix_entry *entry_local;
  Row_access<Gudhi::persistence_matrix::Matrix<Column_compression_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  *this_local;
  
  return;
}

Assistant:

inline void Row_access<Master_matrix>::update_entry(const Matrix_entry& entry) 
{
  if constexpr (!Master_matrix::Option_list::has_intrusive_rows) {
    if (rows_ == nullptr) return;
    auto& row = rows_->at(entry.get_row_index());
    auto it = row.find(entry);
    it = row.erase(it);
    row.insert(it, entry);
  }
}